

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void set_low_temp_var_flag_128x128
               (CommonModeInfoParams *mi_params,PartitionSearchInfo *part_info,MACROBLOCKD *xd,
               VP128x128 *vt,int64_t *thresholds,int mi_col,int mi_row)

{
  int iVar1;
  MB_MODE_INFO **ppMVar2;
  long lVar3;
  VPartVar *none_var;
  int lvl3_idx;
  int64_t threshold_32x32;
  MB_MODE_INFO **mi_32;
  int idx_str1;
  int lvl2_idx;
  int part_idx_3;
  int part_idx_2;
  int64_t threshold_64x64;
  MB_MODE_INFO **mi_64;
  int idx_str;
  int lvl1_idx;
  int part_idx_1;
  int part_idx;
  int mi_col_local;
  int64_t *thresholds_local;
  VP128x128 *vt_local;
  MACROBLOCKD *xd_local;
  PartitionSearchInfo *part_info_local;
  CommonModeInfoParams *mi_params_local;
  
  if ((*xd->mi)->bsize == BLOCK_128X128) {
    if ((long)(vt->part_variances).none.variance < *thresholds >> 1) {
      part_info->variance_low[0] = '\x01';
    }
  }
  else if ((*xd->mi)->bsize == BLOCK_128X64) {
    for (part_idx = 0; part_idx < 2; part_idx = part_idx + 1) {
      if ((long)(vt->part_variances).horz[part_idx].variance < *thresholds >> 2) {
        part_info->variance_low[part_idx + 1] = '\x01';
      }
    }
  }
  else if ((*xd->mi)->bsize == BLOCK_64X128) {
    for (part_idx_1 = 0; part_idx_1 < 2; part_idx_1 = part_idx_1 + 1) {
      if ((long)(vt->part_variances).vert[part_idx_1].variance < *thresholds >> 2) {
        part_info->variance_low[part_idx_1 + 3] = '\x01';
      }
    }
  }
  else {
    for (lvl1_idx = 0; lvl1_idx < 4; lvl1_idx = lvl1_idx + 1) {
      iVar1 = mi_params->mi_stride * (mi_row + set_low_temp_var_flag_128x128::idx64[lvl1_idx][0]) +
              mi_col + set_low_temp_var_flag_128x128::idx64[lvl1_idx][1];
      ppMVar2 = mi_params->mi_grid_base + iVar1;
      if (((*ppMVar2 != (MB_MODE_INFO *)0x0) &&
          (mi_col + set_low_temp_var_flag_128x128::idx64[lvl1_idx][1] < mi_params->mi_cols)) &&
         (mi_row + set_low_temp_var_flag_128x128::idx64[lvl1_idx][0] < mi_params->mi_rows)) {
        if ((*ppMVar2)->bsize == BLOCK_64X64) {
          if ((long)vt->split[lvl1_idx].part_variances.none.variance < thresholds[1] * 5 >> 3) {
            part_info->variance_low[lvl1_idx + 5] = '\x01';
          }
        }
        else {
          lVar3 = thresholds[1] * 5 >> 4;
          if ((*ppMVar2)->bsize == BLOCK_64X32) {
            for (part_idx_2 = 0; part_idx_2 < 2; part_idx_2 = part_idx_2 + 1) {
              if (vt->split[lvl1_idx].part_variances.horz[part_idx_2].variance < lVar3) {
                part_info->variance_low[lvl1_idx * 2 + 9 + part_idx_2] = '\x01';
              }
            }
          }
          else if ((*ppMVar2)->bsize == BLOCK_32X64) {
            for (part_idx_3 = 0; part_idx_3 < 2; part_idx_3 = part_idx_3 + 1) {
              if (vt->split[lvl1_idx].part_variances.vert[part_idx_3].variance < lVar3) {
                part_info->variance_low[lvl1_idx * 2 + 0x11 + part_idx_3] = '\x01';
              }
            }
          }
          else {
            for (lvl2_idx = 0; lvl2_idx < 4; lvl2_idx = lvl2_idx + 1) {
              ppMVar2 = mi_params->mi_grid_base +
                        (long)iVar1 +
                        (long)(mi_params->mi_stride *
                               set_low_temp_var_flag_128x128::idx32[lvl2_idx][0] +
                              set_low_temp_var_flag_128x128::idx32[lvl2_idx][1]);
              if (((*ppMVar2 != (MB_MODE_INFO *)0x0) &&
                  (mi_col + set_low_temp_var_flag_128x128::idx64[lvl1_idx][1] +
                   set_low_temp_var_flag_128x128::idx32[lvl2_idx][1] < mi_params->mi_cols)) &&
                 (mi_row + set_low_temp_var_flag_128x128::idx64[lvl1_idx][0] +
                  set_low_temp_var_flag_128x128::idx32[lvl2_idx][0] < mi_params->mi_rows)) {
                if ((*ppMVar2)->bsize == BLOCK_32X32) {
                  if ((long)vt->split[lvl1_idx].split[lvl2_idx].part_variances.none.variance <
                      thresholds[2] * 5 >> 3) {
                    part_info->variance_low[lvl1_idx * 4 + 0x19 + lvl2_idx] = '\x01';
                  }
                }
                else if ((((*ppMVar2)->bsize == BLOCK_16X16) || ((*ppMVar2)->bsize == BLOCK_32X16))
                        || ((*ppMVar2)->bsize == BLOCK_16X32)) {
                  for (lvl3_idx = 0; lvl3_idx < 4; lvl3_idx = lvl3_idx + 1) {
                    if ((long)vt->split[lvl1_idx].split[lvl2_idx].split[lvl3_idx].part_variances.
                              none.variance < thresholds[3] >> 8) {
                      part_info->variance_low[lvl1_idx * 0x10 + 0x29 + lvl2_idx * 4 + lvl3_idx] =
                           '\x01';
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void set_low_temp_var_flag_128x128(
    CommonModeInfoParams *mi_params, PartitionSearchInfo *part_info,
    MACROBLOCKD *xd, VP128x128 *vt, const int64_t thresholds[], int mi_col,
    int mi_row) {
  if (xd->mi[0]->bsize == BLOCK_128X128) {
    if (vt->part_variances.none.variance < (thresholds[0] >> 1))
      part_info->variance_low[0] = 1;
  } else if (xd->mi[0]->bsize == BLOCK_128X64) {
    for (int part_idx = 0; part_idx < 2; part_idx++) {
      if (vt->part_variances.horz[part_idx].variance < (thresholds[0] >> 2))
        part_info->variance_low[part_idx + 1] = 1;
    }
  } else if (xd->mi[0]->bsize == BLOCK_64X128) {
    for (int part_idx = 0; part_idx < 2; part_idx++) {
      if (vt->part_variances.vert[part_idx].variance < (thresholds[0] >> 2))
        part_info->variance_low[part_idx + 3] = 1;
    }
  } else {
    static const int idx64[4][2] = {
      { 0, 0 }, { 0, 16 }, { 16, 0 }, { 16, 16 }
    };
    static const int idx32[4][2] = { { 0, 0 }, { 0, 8 }, { 8, 0 }, { 8, 8 } };
    for (int lvl1_idx = 0; lvl1_idx < 4; lvl1_idx++) {
      const int idx_str = mi_params->mi_stride * (mi_row + idx64[lvl1_idx][0]) +
                          mi_col + idx64[lvl1_idx][1];
      MB_MODE_INFO **mi_64 = mi_params->mi_grid_base + idx_str;
      if (*mi_64 == NULL) continue;
      if (mi_params->mi_cols <= mi_col + idx64[lvl1_idx][1] ||
          mi_params->mi_rows <= mi_row + idx64[lvl1_idx][0])
        continue;
      const int64_t threshold_64x64 = (5 * thresholds[1]) >> 3;
      if ((*mi_64)->bsize == BLOCK_64X64) {
        if (vt->split[lvl1_idx].part_variances.none.variance < threshold_64x64)
          part_info->variance_low[5 + lvl1_idx] = 1;
      } else if ((*mi_64)->bsize == BLOCK_64X32) {
        for (int part_idx = 0; part_idx < 2; part_idx++)
          if (vt->split[lvl1_idx].part_variances.horz[part_idx].variance <
              (threshold_64x64 >> 1))
            part_info->variance_low[9 + (lvl1_idx << 1) + part_idx] = 1;
      } else if ((*mi_64)->bsize == BLOCK_32X64) {
        for (int part_idx = 0; part_idx < 2; part_idx++)
          if (vt->split[lvl1_idx].part_variances.vert[part_idx].variance <
              (threshold_64x64 >> 1))
            part_info->variance_low[17 + (lvl1_idx << 1) + part_idx] = 1;
      } else {
        for (int lvl2_idx = 0; lvl2_idx < 4; lvl2_idx++) {
          const int idx_str1 =
              mi_params->mi_stride * idx32[lvl2_idx][0] + idx32[lvl2_idx][1];
          MB_MODE_INFO **mi_32 = mi_params->mi_grid_base + idx_str + idx_str1;
          if (*mi_32 == NULL) continue;

          if (mi_params->mi_cols <=
                  mi_col + idx64[lvl1_idx][1] + idx32[lvl2_idx][1] ||
              mi_params->mi_rows <=
                  mi_row + idx64[lvl1_idx][0] + idx32[lvl2_idx][0])
            continue;
          const int64_t threshold_32x32 = (5 * thresholds[2]) >> 3;
          if ((*mi_32)->bsize == BLOCK_32X32) {
            if (vt->split[lvl1_idx]
                    .split[lvl2_idx]
                    .part_variances.none.variance < threshold_32x32)
              part_info->variance_low[25 + (lvl1_idx << 2) + lvl2_idx] = 1;
          } else {
            // For 32x16 and 16x32 blocks, the flag is set on each 16x16 block
            // inside.
            if ((*mi_32)->bsize == BLOCK_16X16 ||
                (*mi_32)->bsize == BLOCK_32X16 ||
                (*mi_32)->bsize == BLOCK_16X32) {
              for (int lvl3_idx = 0; lvl3_idx < 4; lvl3_idx++) {
                VPartVar *none_var = &vt->split[lvl1_idx]
                                          .split[lvl2_idx]
                                          .split[lvl3_idx]
                                          .part_variances.none;
                if (none_var->variance < (thresholds[3] >> 8))
                  part_info->variance_low[41 + (lvl1_idx << 4) +
                                          (lvl2_idx << 2) + lvl3_idx] = 1;
              }
            }
          }
        }
      }
    }
  }
}